

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gptgen.cpp
# Opt level: O1

int read_block(string *drive,uint64_t lba,int block_size,char *buf)

{
  int iVar1;
  ifstream fin;
  long local_230 [4];
  byte abStack_210 [488];
  
  std::ifstream::ifstream(local_230);
  std::ifstream::open((char *)local_230,(_Ios_Openmode)(drive->_M_dataplus)._M_p);
  iVar1 = -1;
  if ((abStack_210[*(long *)(local_230[0] + -0x18)] & 5) == 0) {
    std::istream::seekg(local_230,lba * (long)block_size,0);
    std::istream::read((char *)local_230,(long)buf);
    iVar1 = 0;
    std::ifstream::close();
  }
  std::ifstream::~ifstream(local_230);
  return iVar1;
}

Assistant:

int read_block(string drive, uint64_t lba, int block_size, char *buf)
{
	ifstream fin;

	fin.open(drive.c_str(), ios_base::binary);
	if (!fin)
		return -1;
	fin.seekg(lba*block_size);
	fin.read(buf, block_size);
	fin.close();
	return 0;
}